

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool AdditionHelper<unsigned_char,_unsigned_short,_0>::Addition
               (uchar *lhs,unsigned_short *rhs,uchar *result)

{
  byte bVar1;
  uint uVar2;
  undefined1 *in_RDX;
  ushort *in_RSI;
  byte *in_RDI;
  int32_t tmp;
  
  uVar2 = (uint)*in_RDI + (uint)*in_RSI;
  bVar1 = std::numeric_limits<unsigned_char>::max();
  if (uVar2 <= bVar1) {
    *in_RDX = (char)uVar2;
  }
  return uVar2 <= bVar1;
}

Assistant:

static bool Addition( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        //16-bit or less unsigned addition
        std::int32_t tmp = lhs + rhs;

        if( tmp <= (std::int32_t)std::numeric_limits<T>::max() )
        {
            result = (T)tmp;
            return true;
        }

        return false;
    }